

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_list.h
# Opt level: O2

bool __thiscall PackageList::erase(PackageList *this,string *libname)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  iterator iVar4;
  _Base_ptr p_Var5;
  iterator __position;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  files;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_98;
  string local_70;
  string local_50;
  
  p_Var2 = &local_c8._M_impl.super__Rb_tree_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->packages)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  for (; (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    p_Var3 = *(_Base_ptr *)(p_Var5 + 5);
    for (p_Var6 = p_Var5[4]._M_right; p_Var6 != p_Var3; p_Var6 = p_Var6 + 1) {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&local_c8,(key_type *)p_Var6);
      if ((_Rb_tree_header *)iVar4._M_node == p_Var2) {
        std::__cxx11::string::string((string *)&local_98,(string *)p_Var6);
        local_98.second = 1;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    *)&local_c8,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        iVar4._M_node[2]._M_color = iVar4._M_node[2]._M_color + _S_black;
      }
    }
  }
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
                       *)this,libname);
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    p_Var6 = __position._M_node[4]._M_parent;
    for (p_Var5 = *(_Base_ptr *)(__position._M_node + 4); p_Var5 != p_Var6; p_Var5 = p_Var5 + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)p_Var5);
      ispring::File::FileErase(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    p_Var6 = *(_Base_ptr *)(__position._M_node + 5);
    for (p_Var5 = __position._M_node[4]._M_right; p_Var5 != p_Var6; p_Var5 = p_Var5 + 1) {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&local_c8,(key_type *)p_Var5);
      if (iVar4._M_node[2]._M_color == _S_black) {
        std::__cxx11::string::string((string *)&local_70,(string *)p_Var5);
        ispring::File::FileErase(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Package>,std::_Select1st<std::pair<std::__cxx11::string_const,Package>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Package>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Package>,std::_Select1st<std::pair<std::__cxx11::string_const,Package>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Package>>>
                        *)this,__position);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_c8);
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool erase(std::string libname){
	    std::map<std::string,int> files;
	    for(auto&e:packages){
	        for(auto&f:e.second.lib_files){
	            auto it=files.find(f);
	            if(it==files.end()){
	                files.insert(std::make_pair(f,1));
	            }else{
	                it->second++;
	            }
	        }
	    }

	    auto it=packages.find(libname);
        if(it!=packages.end()){
            for(auto&f:it->second.include_files)
                ispring::File::FileErase(f);
            for(auto&f:it->second.lib_files) {
                auto jt=files.find(f);
                if(jt->second==1) {
                    ispring::File::FileErase(f);
                }
            }
            //Do not remove dll files
            //for(auto&f:it->second.dll_files)
                //ispring::File::FileErase(f);
            packages.erase(it);
            return true;
        }
        return false;
	}